

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O2

void mpp_sthd_stop(MppSThd thd)

{
  uint uVar1;
  char *pcVar2;
  
  check_sthd("mpp_sthd_stop",(MppSThdImpl *)thd);
  pthread_mutex_lock((pthread_mutex_t *)((long)thd + 0x20));
  uVar1 = *(uint *)((long)thd + 0x10);
  if ((uVar1 & 0xfffffffe) == 2) {
    pthread_cond_signal((pthread_cond_t *)((long)thd + 0x48));
  }
  else {
    if ((int)uVar1 < 5) {
      pcVar2 = *(char **)(state2str(MppSThdStatus_e)::strof_sthd_status + (ulong)uVar1 * 8);
    }
    else {
      pcVar2 = "invalid";
    }
    _mpp_log_l(2,"mpp_thread","%s can NOT stop on %s\n",(char *)0x0,*thd,pcVar2);
  }
  pthread_mutex_unlock((pthread_mutex_t *)((long)thd + 0x20));
  check_sthd("mpp_sthd_stop",(MppSThdImpl *)thd);
  return;
}

Assistant:

void mpp_sthd_stop(MppSThd thd)
{
    MppSThdImpl *impl = (MppSThdImpl *)thd;
    MppSThdStatus status;

    CHECK_STHD(impl);

    pthread_mutex_lock(&impl->lock);
    status = impl->status;
    switch (status) {
    case MPP_STHD_RUNNING :
    case MPP_STHD_WAITING : {
        status = MPP_STHD_STOPPING;
        pthread_cond_signal(&impl->cond);
    } break;
    default : {
        mpp_err("%s can NOT stop on %s\n", impl->name, state2str(status));
    } break;
    }
    pthread_mutex_unlock(&impl->lock);

    CHECK_STHD(impl);
}